

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InlinePass::UpdateSucceedingPhis
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks)

{
  pointer puVar1;
  BasicBlock *this_00;
  uint32_t lastId;
  uint32_t firstId;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  puVar1 = (new_blocks->
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  firstId = BasicBlock::id((BasicBlock *)
                           (((new_blocks->
                             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t);
  lastId = BasicBlock::id(puVar1[-1]._M_t.
                          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  this_00 = puVar1[-1]._M_t.
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(uint32_t **)local_48._M_unused._0_8_ = &firstId;
  *(uint32_t **)((long)local_48._M_unused._0_8_ + 8) = &lastId;
  *(InlinePass **)((long)local_48._M_unused._0_8_ + 0x10) = this;
  local_30 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:745:7)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp:745:7)>
             ::_M_manager;
  BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void InlinePass::UpdateSucceedingPhis(
    std::vector<std::unique_ptr<BasicBlock>>& new_blocks) {
  const auto firstBlk = new_blocks.begin();
  const auto lastBlk = new_blocks.end() - 1;
  const uint32_t firstId = (*firstBlk)->id();
  const uint32_t lastId = (*lastBlk)->id();
  const BasicBlock& const_last_block = *lastBlk->get();
  const_last_block.ForEachSuccessorLabel(
      [&firstId, &lastId, this](const uint32_t succ) {
        BasicBlock* sbp = this->id2block_[succ];
        sbp->ForEachPhiInst([&firstId, &lastId](Instruction* phi) {
          phi->ForEachInId([&firstId, &lastId](uint32_t* id) {
            if (*id == firstId) *id = lastId;
          });
        });
      });
}